

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O3

void __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>::
rt_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_plus<double>,1ul>
          (rt_binary_expr<viennamath::rt_expression_interface<double>> *this,
          ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
          *other)

{
  rt_binary_expr<viennamath::rt_expression_interface<double>> *prVar1;
  long *plVar2;
  undefined8 *puVar3;
  rt_binary_expr<viennamath::rt_expression_interface<double>> *this_00;
  long *plVar4;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
  local_2a;
  
  *(undefined ***)this = &PTR__rt_binary_expr_00112840;
  *(undefined8 *)(this + 8) = 0;
  puVar3 = (undefined8 *)operator_new(8);
  *puVar3 = &PTR__op_interface_00112ae0;
  *(undefined8 **)(this + 0x10) = puVar3;
  *(undefined8 *)(this + 0x18) = 0;
  this_00 = (rt_binary_expr<viennamath::rt_expression_interface<double>> *)operator_new(0x20);
  rt_binary_expr<0ul,viennamath::op_mult<double>,0ul>(this_00,&local_2a);
  prVar1 = *(rt_binary_expr<viennamath::rt_expression_interface<double>> **)(this + 8);
  if (prVar1 != this_00) {
    if (prVar1 != (rt_binary_expr<viennamath::rt_expression_interface<double>> *)0x0) {
      (**(code **)(*(long *)prVar1 + 8))();
    }
    *(rt_binary_expr<viennamath::rt_expression_interface<double>> **)(this + 8) = this_00;
  }
  plVar4 = (long *)operator_new(0x10);
  *plVar4 = (long)&PTR__rt_expression_interface_00112be0;
  plVar4[1] = 1;
  plVar2 = *(long **)(this + 0x18);
  if (plVar2 != plVar4) {
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    *(long **)(this + 0x18) = plVar4;
  }
  return;
}

Assistant:

explicit rt_binary_expr(ct_binary_expr<LHS, OP, ct_variable<id> > const & other) : op_(new op_binary<OP, InterfaceType>())
      {
        //std::cout << "Constructing from expression " << other << std::endl;
        lhs_ = std::auto_ptr<InterfaceType>(new rt_binary_expr<InterfaceType>(other.lhs()));
        rhs_ = std::auto_ptr<InterfaceType>(new rt_variable<InterfaceType>(id));
      }